

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_gen_keypair_base
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *G,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  mbedtls_ecp_restart_ctx *in_stack_00000008;
  
  iVar2 = -0x4f80;
  if (((grp->G).X.p != (mbedtls_mpi_uint *)0x0) && ((grp->G).Y.p != (mbedtls_mpi_uint *)0x0)) {
    iVar1 = mbedtls_mpi_random(d,1,&grp->N,f_rng,p_rng);
    iVar2 = -0x4d00;
    if (iVar1 != -0xe) {
      iVar2 = iVar1;
    }
  }
  if (iVar2 == 0) {
    if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      iVar2 = ecp_mul_restartable_internal(grp,Q,d,G,f_rng,p_rng,in_stack_00000008);
      return iVar2;
    }
    iVar2 = -0x4f80;
  }
  return iVar2;
}

Assistant:

int mbedtls_ecp_gen_keypair_base(mbedtls_ecp_group *grp,
                                 const mbedtls_ecp_point *G,
                                 mbedtls_mpi *d, mbedtls_ecp_point *Q,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MBEDTLS_MPI_CHK(mbedtls_ecp_gen_privkey(grp, d, f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_ecp_mul(grp, Q, d, G, f_rng, p_rng));

cleanup:
    return ret;
}